

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

BOOLEAN __thiscall BVStatic<4096UL>::TestRange(BVStatic<4096UL> *this,BVIndex index,uint length)

{
  BOOLEAN BVar1;
  bool bVar2;
  BVIndex index_00;
  BVUnit *pBStack_28;
  uint offset;
  BVUnit *bvUnit;
  uint length_local;
  BVIndex index_local;
  BVStatic<4096UL> *this_local;
  
  AssertRange(this,index);
  AssertRange(this,(index + length) - 1);
  pBStack_28 = BitsFromIndex(this,index);
  index_00 = BVUnitT<unsigned_long>::Offset(index);
  if (index_00 + length < 0x41) {
    this_local._7_1_ = BVUnitT<unsigned_long>::TestRange(pBStack_28,index_00,length);
  }
  else {
    BVar1 = BVUnitT<unsigned_long>::TestRange(pBStack_28,index_00,0x40 - index_00);
    if (BVar1 == '\0') {
      this_local._7_1_ = '\0';
    }
    else {
      for (bvUnit._0_4_ = length - (0x40 - index_00); pBStack_28 = pBStack_28 + 1,
          0x3f < (uint)bvUnit; bvUnit._0_4_ = (uint)bvUnit - 0x40) {
        bVar2 = BVUnitT<unsigned_long>::IsFull(pBStack_28);
        if (!bVar2) {
          return '\0';
        }
      }
      if (((uint)bvUnit == 0) ||
         (BVar1 = BVUnitT<unsigned_long>::TestRange(pBStack_28,0,(uint)bvUnit), BVar1 != '\0')) {
        this_local._7_1_ = '\x01';
      }
      else {
        this_local._7_1_ = '\0';
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

BOOLEAN TestRange(const BVIndex index, uint length) const
    {
        AssertRange(index);
        AssertRange(index + length - 1);

        const BVUnit * bvUnit = BitsFromIndex(index);
        uint offset = BVUnit::Offset(index);

        if (offset + length <= BVUnit::BitsPerWord)
        {
            // Bit range is in a single word
            return bvUnit->TestRange(offset, length);
        }

        // Bit range spans words.
        // Test the first word, from start offset to end of word
        if (!bvUnit->TestRange(offset, (BVUnit::BitsPerWord - offset)))
        {
            return FALSE;
        }

        bvUnit++;
        length -= (BVUnit::BitsPerWord - offset);

        // Test entire words until we are at the last word
        while (length >= BVUnit::BitsPerWord)
        {
            if (!bvUnit->IsFull())
            {
                return FALSE;
            }

            bvUnit++;
            length -= BVUnit::BitsPerWord;
        }

        // Test last word (unless we already ended on a word boundary)
        if (length > 0)
        {
            if (!bvUnit->TestRange(0, length))
            {
                return FALSE;
            }
        }

        return TRUE;
    }